

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::F_formatter<spdlog::details::null_scoped_padder>::format
          (F_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  unsigned_long n;
  null_scoped_padder local_41;
  undefined8 uStack_40;
  null_scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> ns;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  F_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  ns.__r = (rep)dest;
  local_30 = fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((msg->time).__d.__r);
  uStack_40 = 9;
  null_scoped_padder::null_scoped_padder
            (&local_41,9,&(this->super_flag_formatter).padinfo_,(memory_buf_t *)ns.__r);
  n = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_30);
  fmt_helper::pad9<unsigned_long>(n,(memory_buf_t *)ns.__r);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }